

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_lcl.c
# Opt level: O1

size_t bignStart_keep(size_t l,bign_deep_i deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong no;
  ulong n;
  
  no = l * 2 + 7 >> 3;
  n = l * 2 + 0x3f >> 6;
  sVar1 = gfpCreate_keep(no);
  sVar2 = gfpCreate_deep(no);
  sVar3 = ecpCreateJ_keep(n);
  sVar4 = ecpCreateJ_deep(n,sVar2);
  sVar5 = ecCreateGroup_deep(sVar2);
  if (deep == (bign_deep_i)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = (*deep)(n,sVar2,3,sVar4);
  }
  sVar2 = utilMax(3,sVar4,sVar5,sVar2);
  return sVar2 + sVar3 + sVar1;
}

Assistant:

size_t bignStart_keep(size_t l, bign_deep_i deep)
{
	// размерности
	size_t no = O_OF_B(2 * l);
	size_t n = W_OF_B(2 * l);
	size_t f_keep = gfpCreate_keep(no);
	size_t f_deep = gfpCreate_deep(no);
	size_t ec_d = 3;
	size_t ec_keep = ecpCreateJ_keep(n);
	size_t ec_deep = ecpCreateJ_deep(n, f_deep);
	// расчет
	return f_keep + ec_keep +
		utilMax(3,
			ec_deep,
			ecCreateGroup_deep(f_deep),
			deep ? deep(n, f_deep, ec_d, ec_deep) : 0);
}